

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

bool Js::TypedArrayCompareElementsHelper<short>(CompareVarsInfo *cvInfo,void *elem1,void *elem2)

{
  short sVar1;
  short sVar2;
  RecyclableObject *this;
  ScriptContext *scriptContext;
  RecyclableObject *pRVar3;
  ThreadContext *this_00;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  JavascriptMethod p_Var7;
  Var pvVar8;
  Var pvVar9;
  double dVar10;
  double value;
  
  if (elem1 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x865,"(element1 != nullptr)","element1 != nullptr");
    if (!bVar5) goto LAB_00d76bf2;
    *puVar6 = 0;
  }
  if (elem2 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x866,"(element2 != nullptr)","element2 != nullptr");
    if (!bVar5) goto LAB_00d76bf2;
    *puVar6 = 0;
  }
  if (cvInfo == (CompareVarsInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x867,"(cvInfo != nullptr)","cvInfo != nullptr");
    if (!bVar5) goto LAB_00d76bf2;
    *puVar6 = 0;
  }
  sVar1 = *elem1;
  sVar2 = *elem2;
  dVar10 = (double)(int)sVar1;
  bVar5 = NumberUtilities::IsNan(dVar10);
  if (bVar5) {
    bVar5 = false;
  }
  else {
    value = (double)(int)sVar2;
    bVar5 = NumberUtilities::IsNan(value);
    if (bVar5) {
      return true;
    }
    this = (cvInfo->compFn).ptr;
    if (this == (RecyclableObject *)0x0) {
      return sVar1 < sVar2;
    }
    scriptContext =
         (((((this->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
         ptr;
    pRVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    this_00 = scriptContext->threadContext;
    bVar5 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(this);
    CheckIsExecutable(this,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(this);
    pvVar8 = JavascriptNumber::ToVarNoCheck(dVar10,scriptContext);
    pvVar9 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
    pvVar8 = (*p_Var7)(this,(CallInfo)this,0x2000003,0,0,0,0,0x2000003,pRVar3,pvVar8,pvVar9);
    this_00->reentrancySafeOrHandled = bVar5;
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pvVar8 >> 0x32 == 0) {
          dVar10 = JavascriptConversion::ToNumber_Full(pvVar8,scriptContext);
        }
        else {
          dVar10 = (double)((ulong)pvVar8 ^ 0xfffc000000000000);
        }
        return dVar10 < 0.0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00d76bf2;
      *puVar6 = 0;
    }
    if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) {
LAB_00d76bf2:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    bVar5 = (bool)((byte)((ulong)pvVar8 >> 0x1f) & 1);
  }
  return bVar5;
}

Assistant:

bool TypedArrayCompareElementsHelper(JavascriptArray::CompareVarsInfo* cvInfo, const void* elem1, const void* elem2)
    {
        const T* element1 = static_cast<const T*>(elem1);
        const T* element2 = static_cast<const T*>(elem2);

        Assert(element1 != nullptr);
        Assert(element2 != nullptr);
        Assert(cvInfo != nullptr);

        const T x = *element1;
        const T y = *element2;

        // ECMA2023 spec requires that NaN values are sorted to the end
        if (NumberUtilities::IsNan((double)x))
        {
            return false;
        }
        else if (NumberUtilities::IsNan((double)y))
        {
            return true;
        }

        if (cvInfo->compFn != nullptr)
        {
            RecyclableObject* compFn = cvInfo->compFn;
            ScriptContext* scriptContext = compFn->GetScriptContext();
            Var undefined = scriptContext->GetLibrary()->GetUndefined();
            Var retVal = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                retVal = CALL_FUNCTION(scriptContext->GetThreadContext(),
                            compFn, CallInfo(CallFlags_Value, 3),
                            undefined,
                            JavascriptNumber::ToVarNoCheck((double)x, scriptContext),
                            JavascriptNumber::ToVarNoCheck((double)y, scriptContext));
            }
            END_SAFE_REENTRANT_CALL

            if (TaggedInt::Is(retVal))
            {
                return TaggedInt::ToInt32(retVal) < 0;
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(retVal))
            {
                return JavascriptNumber::GetValue(retVal) < 0;
            }

            return JavascriptConversion::ToNumber_Full(retVal, scriptContext) < 0;
        }
        else // simple comparison when no user method provided
        {
            return x < y;
        }
    }